

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<double> * __thiscall
tinyusdz::Attribute::get_value<double>(optional<double> *__return_storage_ptr__,Attribute *this)

{
  optional<double> local_20;
  
  primvar::PrimVar::get_value<double>(&local_20,&this->_var);
  __return_storage_ptr__->has_value_ = local_20.has_value_;
  if (local_20.has_value_ == true) {
    __return_storage_ptr__->contained = local_20.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }